

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void searchlight_movement(searchlight_movement_t *slstate)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  char cVar3;
  uint8_t uVar4;
  byte bVar5;
  byte bVar6;
  
  uVar4 = (slstate->xy).x;
  uVar1 = (slstate->xy).y;
  puVar2 = &slstate->counter;
  *puVar2 = *puVar2 + 0xff;
  if (*puVar2 != '\0') {
    bVar5 = slstate->index >> 6 & 2;
    bVar6 = bVar5 ^ slstate->direction;
    cVar3 = -2;
    if (slstate->direction != bVar5) {
      cVar3 = (bVar6 != 3) * '\x04' + -2;
    }
    (slstate->xy).x = cVar3 + uVar4;
    (slstate->xy).y = (-(bVar6 < 2) | 1U) + uVar1;
    return;
  }
  bVar5 = slstate->index;
  if ((char)bVar5 < '\0') {
    if ((bVar5 & 0x7f) == 0) {
      slstate->index = '\0';
      bVar6 = 0;
      bVar5 = 0;
    }
    else {
      bVar6 = bVar5 - 1;
      slstate->index = bVar6;
      bVar5 = (bVar5 & 0x7f) - 1;
    }
  }
  else {
    bVar6 = bVar5 + 1;
    slstate->index = bVar6;
    bVar5 = bVar6;
  }
  puVar2 = slstate->ptr + (ulong)bVar5 * 2;
  uVar4 = *puVar2;
  if (uVar4 == 0xff) {
    slstate->index = bVar6 - 1 | 0x80;
    uVar4 = puVar2[-2];
    puVar2 = puVar2 + -2;
  }
  slstate->counter = uVar4;
  slstate->direction = puVar2[1];
  return;
}

Assistant:

void searchlight_movement(searchlight_movement_t *slstate)
{
#define REVERSE (1 << 7)

  uint8_t        x,y;       /* was E,D */
  uint8_t        index;     /* was A */
  const uint8_t *ptr;       /* was BC */
  direction_t    direction; /* was A */

  assert(slstate != NULL);

  x = slstate->xy.x;
  y = slstate->xy.y;
  if (--slstate->counter == 0)
  {
    /* End of previous sweep: work out the next. */

    index = slstate->index; // sampled HL = $AD3B, $AD34, $AD2D
    if (index & REVERSE) /* reverse direction bit set */
    {
      index &= ~REVERSE;
      if (index == 0)
      {
        slstate->index &= ~REVERSE; /* clear direction bit when index hits zero */
      }
      else
      {
        slstate->index--; /* count down */
        index--; /* just a copy sans direction bit */
        assert(index == (slstate->index ^ REVERSE));
      }
    }
    else
    {
      slstate->index = ++index; /* count up */
    }
    assert(index <= 8); // movement_1 is the longest
    ptr = slstate->ptr + index * 2;
    if (*ptr == 255) /* end of list? */
    {
      slstate->index--; /* overshot? count down counter byte */
      slstate->index |= REVERSE; /* go negative */
      ptr -= 2;
      // A = *ptr; /* BUG: This is a flaw in original code: A is fetched but never used again. */
    }
    /* Copy counter + direction_t. */
    slstate->counter   = ptr[0];
    slstate->direction = ptr[1];
  }
  else
  {
    direction = slstate->direction;
    if (slstate->index & REVERSE) /* test sign */
      direction ^= 2; /* toggle direction */

    /* Conv: This is the [-2]+1 pattern which works out -1/+1. */
    if (direction <= direction_TOP_RIGHT) /* direction_TOP_* */
      y--;
    else
      y++;

    if (direction != direction_TOP_LEFT &&
        direction != direction_BOTTOM_LEFT)
      x += 2; /* direction_*_RIGHT */
    else
      x -= 2; /* direction_*_LEFT */

    slstate->xy.x = x; // Conv: Reversed store order.
    slstate->xy.y = y;
  }

#undef REVERSE
}